

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::hugeint_t,duckdb::QuantileListOperation<duckdb::hugeint_t,true>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  hugeint_t *input_00;
  data_ptr_t pdVar1;
  ulong uVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  unsigned_long *puVar9;
  ulong uVar10;
  long lVar11;
  unsigned_long *puVar12;
  idx_t iVar13;
  unsigned_long *puVar14;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_98;
  ValidityMask *local_50;
  AggregateUnaryInput local_48;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_98.data = (data_ptr_t)&input->validity;
    local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      puVar12 = (unsigned_long *)0x0;
      uVar10 = 0;
      puVar9 = (unsigned_long *)0x0;
      local_98.sel = (SelectionVector *)aggr_input_data;
      local_50 = (ValidityMask *)local_98.data;
      do {
        puVar14 = (local_50->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar14 == (unsigned_long *)0x0) {
          puVar14 = puVar9 + 8;
          if (count <= puVar9 + 8) {
            puVar14 = (unsigned_long *)count;
          }
joined_r0x00e1bf6a:
          while (puVar8 = puVar12, puVar5 = puVar12,
                puVar6 = local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask,
                puVar12 < puVar14) {
            QuantileOperation::
            Operation<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::hugeint_t,true>>
                      ((QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)state,
                       (hugeint_t *)(pdVar1 + (long)puVar12 * 0x10),(AggregateUnaryInput *)&local_98
                      );
            puVar12 = (unsigned_long *)
                      ((long)local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_mask + 1);
            local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar12;
          }
        }
        else {
          uVar2 = puVar14[uVar10];
          puVar14 = puVar9 + 8;
          if (count <= puVar9 + 8) {
            puVar14 = (unsigned_long *)count;
          }
          if (uVar2 == 0xffffffffffffffff) goto joined_r0x00e1bf6a;
          puVar8 = puVar14;
          puVar5 = puVar14;
          puVar6 = puVar14;
          puVar7 = puVar9;
          puVar4 = local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (uVar2 != 0) {
            while (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                        puVar7,
                  puVar8 = local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask, puVar5 = puVar12, puVar6 = puVar4,
                  local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask <
                  puVar14) {
              if ((uVar2 >> ((ulong)(uint)((int)local_98.validity.
                                                super_TemplatedValidityMask<unsigned_long>.
                                                validity_mask - (int)puVar9) & 0x3f) & 1) != 0) {
                lVar11 = (long)local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask * 0x10;
                local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
                QuantileOperation::
                Operation<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::hugeint_t,true>>
                          ((QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)state,
                           (hugeint_t *)(pdVar1 + lVar11),(AggregateUnaryInput *)&local_98);
              }
              puVar12 = (unsigned_long *)
                        ((long)local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask + 1);
              puVar4 = puVar12;
              puVar7 = puVar12;
            }
          }
        }
        local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar6;
        puVar12 = puVar5;
        uVar10 = uVar10 + 1;
        puVar9 = puVar8;
      } while (uVar10 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar12 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar12 == (unsigned_long *)0x0) || ((*puVar12 & 1) != 0)) {
      input_00 = (hugeint_t *)input->data;
      local_98.data = (data_ptr_t)&input->validity;
      local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      if (count != 0) {
        local_98.sel = (SelectionVector *)aggr_input_data;
        do {
          QuantileOperation::
          Operation<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::hugeint_t,true>>
                    ((QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)state,
                     input_00,(AggregateUnaryInput *)&local_98);
          count = count - 1;
        } while (count != 0);
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_98);
    Vector::ToUnifiedFormat(input,count,&local_98);
    local_48.input_mask = &local_98.validity;
    local_48.input = aggr_input_data;
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = (local_98.sel)->sel_vector;
        iVar13 = 0;
        do {
          local_48.input_idx = iVar13;
          if (psVar3 != (sel_t *)0x0) {
            local_48.input_idx = (idx_t)psVar3[iVar13];
          }
          QuantileOperation::
          Operation<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::hugeint_t,true>>
                    ((QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)state,
                     (hugeint_t *)(local_98.data + local_48.input_idx * 0x10),&local_48);
          iVar13 = iVar13 + 1;
        } while (count != iVar13);
      }
    }
    else if (count != 0) {
      psVar3 = (local_98.sel)->sel_vector;
      iVar13 = 0;
      do {
        local_48.input_idx = iVar13;
        if (psVar3 != (sel_t *)0x0) {
          local_48.input_idx = (idx_t)psVar3[iVar13];
        }
        if ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [local_48.input_idx >> 6] >> (local_48.input_idx & 0x3f) & 1) != 0)) {
          QuantileOperation::
          Operation<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::hugeint_t,true>>
                    ((QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)state,
                     (hugeint_t *)(local_98.data + local_48.input_idx * 0x10),&local_48);
        }
        iVar13 = iVar13 + 1;
      } while (count != iVar13);
    }
    if (local_98.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}